

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

intercept_t * __thiscall FPathTraverse::Next(FPathTraverse *this)

{
  uint uVar1;
  bool bVar2;
  intercept_t *piVar3;
  long lVar4;
  intercept_t *scan;
  intercept_t *piVar5;
  double dVar6;
  
  uVar1 = this->intercept_index;
  if (uVar1 < intercepts.Count) {
    piVar5 = intercepts.Array + uVar1;
    lVar4 = (ulong)intercepts.Count - (ulong)uVar1;
    dVar6 = 3.4028234663852886e+38;
    piVar3 = (intercept_t *)0x0;
    do {
      if ((piVar5->frac < dVar6) && (piVar5->done == false)) {
        piVar3 = piVar5;
        dVar6 = piVar5->frac;
      }
      piVar5 = piVar5 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    bVar2 = 1.0 < dVar6;
  }
  else {
    bVar2 = true;
    piVar3 = (intercept_t *)0x0;
  }
  if ((bool)(piVar3 == (intercept_t *)0x0 | bVar2)) {
    return (intercept_t *)0x0;
  }
  piVar3->done = true;
  return piVar3;
}

Assistant:

intercept_t *FPathTraverse::Next()
{
	intercept_t *in = NULL;

	double dist = FLT_MAX;
	for (unsigned scanpos = intercept_index; scanpos < intercepts.Size (); scanpos++)
	{
		intercept_t *scan = &intercepts[scanpos];
		if (scan->frac < dist && !scan->done)
		{
			dist = scan->frac;
			in = scan;
		}
	}
	
	if (dist > 1. || in == NULL) return NULL;	// checked everything in range			
	in->done = true;
	return in;
}